

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderMoreInputVerticesThanAvailableTest::iterate
          (GeometryShaderMoreInputVerticesThanAvailableTest *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  deUint32 dVar6;
  ulong uVar7;
  GLuint *pGVar8;
  NotSupportedError *this_00;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  TestLog *this_01;
  MessageBuilder *pMVar11;
  string *local_380;
  MessageBuilder local_318;
  uint local_194;
  char *pcStack_190;
  GLuint i_1;
  char *vs_code_specialized_raw;
  string vs_code_specialized;
  char *gs_codes_specialized_raw [5];
  undefined1 local_138 [8];
  string gs_codes_specialized [5];
  char *local_90;
  char *fs_code_specialized_raw;
  string fs_code_specialized;
  GLuint i;
  Functions *gl;
  bool local_41;
  bool result;
  char *pcStack_40;
  bool has_shader_compilation_failed;
  char *gs_code_triangles_adjacency;
  char *gs_code_triangles;
  char *gs_code_lines_adjacency;
  char *gs_code_lines;
  char *gs_code_points;
  GeometryShaderMoreInputVerticesThanAvailableTest *this_local;
  long lVar10;
  
  gs_code_lines =
       "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                   in;\nlayout (points, max_vertices = 1) out;\n\nvoid main()\n{\n    gl_Position = gl_in[1].gl_Position;\n    EmitVertex();\n}\n"
  ;
  gs_code_lines_adjacency =
       "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (lines)                    in;\nlayout (points, max_vertices = 1) out;\n\nvoid main()\n{\n    gl_Position = gl_in[2].gl_Position;\n    EmitVertex();\n}\n"
  ;
  gs_code_triangles =
       "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (lines_adjacency)          in;\nlayout (points, max_vertices = 1) out;\n\nvoid main()\n{\n    gl_Position = gl_in[4].gl_Position;\n    EmitVertex();\n}\n"
  ;
  gs_code_triangles_adjacency =
       "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (triangles)                in;\nlayout (points, max_vertices = 1) out;\n\nvoid main()\n{\n    gl_Position = gl_in[3].gl_Position;\n    EmitVertex();\n}\n"
  ;
  pcStack_40 = 
  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (triangles_adjacency)      in;\nlayout (points, max_vertices = 1) out;\n\nvoid main()\n{\n    gl_Position = gl_in[6].gl_Position;\n    EmitVertex();\n}\n"
  ;
  local_41 = true;
  bVar2 = true;
  auVar1 = ZEXT416(this->m_number_of_gs) * ZEXT816(4);
  uVar7 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  gs_code_points = (char *)this;
  pGVar8 = (GLuint *)operator_new__(uVar7);
  this->m_gs_ids = pGVar8;
  auVar1 = ZEXT416(this->m_number_of_gs) * ZEXT816(4);
  uVar7 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pGVar8 = (GLuint *)operator_new__(uVar7);
  this->m_po_ids = pGVar8;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
               ,0x899);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar9 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar4 = (*pRVar9->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar4);
  for (fs_code_specialized.field_2._12_4_ = 0;
      (uint)fs_code_specialized.field_2._12_4_ < this->m_number_of_gs;
      fs_code_specialized.field_2._12_4_ = fs_code_specialized.field_2._12_4_ + 1) {
    GVar5 = (**(code **)(lVar10 + 0x3f0))(0x8dd9);
    this->m_gs_ids[(uint)fs_code_specialized.field_2._12_4_] = GVar5;
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x8a2);
    GVar5 = (**(code **)(lVar10 + 0x3c8))();
    this->m_po_ids[(uint)fs_code_specialized.field_2._12_4_] = GVar5;
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"glCreateShader() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x8a5);
  }
  GVar5 = (**(code **)(lVar10 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar5;
  GVar5 = (**(code **)(lVar10 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar5;
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                  ,0x8ab);
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&fs_code_specialized_raw,&this->super_TestCaseBase,1,&dummy_fs_code);
  local_90 = (char *)std::__cxx11::string::c_str();
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)local_138,&this->super_TestCaseBase,1,&gs_code_lines);
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)((long)&gs_codes_specialized[0].field_2 + 8),&this->super_TestCaseBase,1,
             &gs_code_lines_adjacency);
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)((long)&gs_codes_specialized[1].field_2 + 8),&this->super_TestCaseBase,1,
             &gs_code_triangles);
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)((long)&gs_codes_specialized[2].field_2 + 8),&this->super_TestCaseBase,1,
             &gs_code_triangles_adjacency);
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)((long)&gs_codes_specialized[3].field_2 + 8),&this->super_TestCaseBase,1,
             &stack0xffffffffffffffc0);
  vs_code_specialized.field_2._8_8_ = std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&vs_code_specialized_raw,&this->super_TestCaseBase,1,&dummy_vs_code);
  pcStack_190 = (char *)std::__cxx11::string::c_str();
  local_194 = 0;
  do {
    if (this->m_number_of_gs <= local_194) {
LAB_015c4926:
      if (bVar2) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      this_local._4_4_ = STOP;
      std::__cxx11::string::~string((string *)&vs_code_specialized_raw);
      local_380 = (string *)(gs_codes_specialized[4].field_2._M_local_buf + 8);
      do {
        local_380 = local_380 + -0x20;
        std::__cxx11::string::~string(local_380);
      } while (local_380 != (string *)local_138);
      std::__cxx11::string::~string((string *)&fs_code_specialized_raw);
      return this_local._4_4_;
    }
    uVar7 = (ulong)local_194;
    bVar3 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_ids[uVar7],this->m_fs_id,1,&local_90,
                       this->m_gs_ids[uVar7],1,gs_codes_specialized_raw + (uVar7 - 1),this->m_vs_id,
                       1,&stack0xfffffffffffffe70,&local_41);
    if (bVar3) {
      this_01 = tcu::TestContext::getLog
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_318,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar11 = tcu::MessageBuilder::operator<<
                          (&local_318,(char (*) [43])"Program object linking successful for i = ");
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2c3fdfc);
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_194);
      pMVar11 = tcu::MessageBuilder::operator<<
                          (pMVar11,(char (*) [35])"], whereas a failure was expected.");
      tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_318);
      bVar2 = false;
      goto LAB_015c4926;
    }
    local_194 = local_194 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderMoreInputVerticesThanAvailableTest::iterate()
{
	/* Define 5 Geometry Shaders for purpose of this test. */
	const char* gs_code_points = "${VERSION}\n"
								 "${GEOMETRY_SHADER_REQUIRE}\n"
								 "\n"
								 "layout (points)                   in;\n"
								 "layout (points, max_vertices = 1) out;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    gl_Position = gl_in[1].gl_Position;\n"
								 "    EmitVertex();\n"
								 "}\n";

	const char* gs_code_lines = "${VERSION}\n"
								"${GEOMETRY_SHADER_REQUIRE}\n"
								"\n"
								"layout (lines)                    in;\n"
								"layout (points, max_vertices = 1) out;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    gl_Position = gl_in[2].gl_Position;\n"
								"    EmitVertex();\n"
								"}\n";

	const char* gs_code_lines_adjacency = "${VERSION}\n"
										  "${GEOMETRY_SHADER_REQUIRE}\n"
										  "\n"
										  "layout (lines_adjacency)          in;\n"
										  "layout (points, max_vertices = 1) out;\n"
										  "\n"
										  "void main()\n"
										  "{\n"
										  "    gl_Position = gl_in[4].gl_Position;\n"
										  "    EmitVertex();\n"
										  "}\n";

	const char* gs_code_triangles = "${VERSION}\n"
									"${GEOMETRY_SHADER_REQUIRE}\n"
									"\n"
									"layout (triangles)                in;\n"
									"layout (points, max_vertices = 1) out;\n"
									"\n"
									"void main()\n"
									"{\n"
									"    gl_Position = gl_in[3].gl_Position;\n"
									"    EmitVertex();\n"
									"}\n";

	const char* gs_code_triangles_adjacency = "${VERSION}\n"
											  "${GEOMETRY_SHADER_REQUIRE}\n"
											  "\n"
											  "layout (triangles_adjacency)      in;\n"
											  "layout (points, max_vertices = 1) out;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "    gl_Position = gl_in[6].gl_Position;\n"
											  "    EmitVertex();\n"
											  "}\n";

	bool has_shader_compilation_failed = true;
	bool result						   = true;

	m_gs_ids = new glw::GLuint[m_number_of_gs];
	m_po_ids = new glw::GLuint[m_number_of_gs];

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create program objects & geometry shader objects. */
	for (glw::GLuint i = 0; i < m_number_of_gs; ++i)
	{
		m_gs_ids[i] = gl.createShader(GL_GEOMETRY_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

		m_po_ids[i] = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");
	}

	/* Create shader object. */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Try to link the test program object */
	std::string fs_code_specialized		= specializeShader(1, &dummy_fs_code);
	const char* fs_code_specialized_raw = fs_code_specialized.c_str();

	std::string gs_codes_specialized[] = { specializeShader(1, &gs_code_points), specializeShader(1, &gs_code_lines),
										   specializeShader(1, &gs_code_lines_adjacency),
										   specializeShader(1, &gs_code_triangles),
										   specializeShader(1, &gs_code_triangles_adjacency) };

	const char* gs_codes_specialized_raw[] = { gs_codes_specialized[0].c_str(), gs_codes_specialized[1].c_str(),
											   gs_codes_specialized[2].c_str(), gs_codes_specialized[3].c_str(),
											   gs_codes_specialized[4].c_str() };

	std::string vs_code_specialized		= specializeShader(1, &dummy_vs_code);
	const char* vs_code_specialized_raw = vs_code_specialized.c_str();

	for (glw::GLuint i = 0; i < m_number_of_gs; ++i)
	{
		if (TestCaseBase::buildProgram(m_po_ids[i], m_fs_id, 1,					 /* n_sh1_body_parts */
									   &fs_code_specialized_raw, m_gs_ids[i], 1, /* n_sh2_body_parts */
									   &gs_codes_specialized_raw[i], m_vs_id, 1, /* n_sh3_body_parts */
									   &vs_code_specialized_raw, &has_shader_compilation_failed))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Program object linking successful for i = "
							   << "[" << i << "], whereas a failure was expected." << tcu::TestLog::EndMessage;

			result = false;
			break;
		}
	}

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}